

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCaseInfo *testInfo)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  SourceLineInfo *pSVar4;
  ulong uVar5;
  pair<std::_Rb_tree_const_iterator<Catch::TestCaseInfo>,_bool> pVar6;
  SourceLineInfo local_308;
  SourceLineInfo local_2e0;
  _Rb_tree_const_iterator<Catch::TestCaseInfo> local_2b8;
  reference local_2b0;
  TestCaseInfo *prev;
  undefined1 local_2a0;
  _Self local_298;
  _Self local_290;
  string local_288;
  TestCaseInfo local_268;
  ostringstream local_190 [8];
  ostringstream oss;
  TestCaseInfo *testInfo_local;
  TestRegistry *this_local;
  
  psVar2 = TestCaseInfo::getName_abi_cxx11_(testInfo);
  bVar1 = std::operator==(psVar2,"");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    psVar2 = TestCaseInfo::getName_abi_cxx11_(testInfo);
    poVar3 = std::operator<<((ostream *)local_190,(string *)psVar2);
    poVar3 = std::operator<<(poVar3,"unnamed/");
    uVar5 = this->m_unnamedCount + 1;
    this->m_unnamedCount = uVar5;
    std::ostream::operator<<(poVar3,uVar5);
    std::__cxx11::ostringstream::str();
    TestCaseInfo::TestCaseInfo(&local_268,testInfo,&local_288);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_268);
    TestCaseInfo::~TestCaseInfo(&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    local_290._M_node =
         (_Base_ptr)
         std::
         set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
         ::find(&this->m_functions,testInfo);
    local_298._M_node =
         (_Base_ptr)
         std::
         set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
         ::end(&this->m_functions);
    bVar1 = std::operator==(&local_290,&local_298);
    if (!bVar1) {
      local_2b8._M_node =
           (_Base_ptr)
           std::
           set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
           ::find(&this->m_functions,testInfo);
      local_2b0 = std::_Rb_tree_const_iterator<Catch::TestCaseInfo>::operator*(&local_2b8);
      poVar3 = std::operator<<((ostream *)&std::cerr,"error: TEST_CASE( \"");
      psVar2 = TestCaseInfo::getName_abi_cxx11_(testInfo);
      poVar3 = std::operator<<(poVar3,(string *)psVar2);
      poVar3 = std::operator<<(poVar3,"\" ) already defined.\n");
      poVar3 = std::operator<<(poVar3,"\tFirst seen at ");
      pSVar4 = TestCaseInfo::getLineInfo(local_2b0);
      SourceLineInfo::SourceLineInfo(&local_2e0,pSVar4);
      poVar3 = Catch::operator<<(poVar3,&local_2e0);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tRedefined at ");
      pSVar4 = TestCaseInfo::getLineInfo(testInfo);
      SourceLineInfo::SourceLineInfo(&local_308,pSVar4);
      poVar3 = Catch::operator<<(poVar3,&local_308);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      SourceLineInfo::~SourceLineInfo(&local_308);
      SourceLineInfo::~SourceLineInfo(&local_2e0);
      exit(1);
    }
    pVar6 = std::
            set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
            ::insert(&this->m_functions,testInfo);
    prev = (TestCaseInfo *)pVar6.first._M_node;
    local_2a0 = pVar6.second;
    std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
              (&this->m_functionsInOrder,testInfo);
    bVar1 = TestCaseInfo::isHidden(testInfo);
    if (!bVar1) {
      std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
                (&this->m_nonHiddenFunctions,testInfo);
    }
  }
  return;
}

Assistant:

virtual void registerTest( const TestCaseInfo& testInfo ) {
            if( testInfo.getName() == "" ) {
                std::ostringstream oss;
                oss << testInfo.getName() << "unnamed/" << ++m_unnamedCount;
                return registerTest( TestCaseInfo( testInfo, oss.str() ) );
            }

            if( m_functions.find( testInfo ) == m_functions.end() ) {
                m_functions.insert( testInfo );
                m_functionsInOrder.push_back( testInfo );
                if( !testInfo.isHidden() )
                    m_nonHiddenFunctions.push_back( testInfo );
            }
            else {
                const TestCaseInfo& prev = *m_functions.find( testInfo );
                std::cerr   << "error: TEST_CASE( \"" << testInfo.getName() << "\" ) already defined.\n"
                            << "\tFirst seen at " << SourceLineInfo( prev.getLineInfo() ) << "\n"
                            << "\tRedefined at " << SourceLineInfo( testInfo.getLineInfo() ) << std::endl;
                exit(1);
            }
        }